

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O1

string * __thiscall
mocker::nasm::fmtAddr_abi_cxx11_
          (string *__return_storage_ptr__,nasm *this,shared_ptr<mocker::nasm::Addr> *addr)

{
  bool bVar1;
  _Alloc_hider _Var2;
  uint uVar3;
  uint uVar4;
  long *plVar5;
  undefined8 *puVar6;
  uint uVar7;
  ulong uVar8;
  ulong *puVar9;
  size_type *psVar10;
  shared_ptr<mocker::nasm::Addr> *addr_00;
  shared_ptr<mocker::nasm::Addr> *extraout_RDX;
  shared_ptr<mocker::nasm::Addr> *extraout_RDX_00;
  shared_ptr<mocker::nasm::Addr> *extraout_RDX_01;
  shared_ptr<mocker::nasm::Addr> *addr_01;
  shared_ptr<mocker::nasm::Addr> *extraout_RDX_02;
  ulong uVar11;
  string *__str;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  string __str_2;
  shared_ptr<mocker::nasm::NumericConstant> p;
  shared_ptr<mocker::nasm::MemoryAddr> p_2;
  string __str_1;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  ulong *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  ulong local_a8;
  long lStack_a0;
  long local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  undefined8 local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  long local_58;
  string local_50;
  
  dyc<mocker::nasm::NumericConstant,std::shared_ptr<mocker::nasm::Addr>const&>
            ((nasm *)&local_d8,(shared_ptr<mocker::nasm::Addr> *)this);
  _Var2._M_p = local_d8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    uVar11 = *(ulong *)(local_d8._M_dataplus._M_p + 8);
    uVar12 = -uVar11;
    if (0 < (long)uVar11) {
      uVar12 = uVar11;
    }
    uVar14 = 1;
    if (9 < uVar12) {
      uVar8 = uVar12;
      uVar3 = 4;
      do {
        uVar14 = uVar3;
        if (uVar8 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_001a8e81;
        }
        if (uVar8 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_001a8e81;
        }
        if (uVar8 < 10000) goto LAB_001a8e81;
        bVar1 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        uVar3 = uVar14 + 4;
      } while (bVar1);
      uVar14 = uVar14 + 1;
    }
LAB_001a8e81:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct
              ((ulong)__return_storage_ptr__,(char)uVar14 - (char)((long)uVar11 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((__return_storage_ptr__->_M_dataplus)._M_p + -((long)uVar11 >> 0x3f),uVar14,uVar12);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var2._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    return __return_storage_ptr__;
  }
  dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>const&>
            ((nasm *)&local_d8,(shared_ptr<mocker::nasm::Addr> *)this);
  _Var2._M_p = local_d8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*(long *)(local_d8._M_dataplus._M_p + 8),
               *(long *)(local_d8._M_dataplus._M_p + 0x10) +
               *(long *)(local_d8._M_dataplus._M_p + 8));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var2._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    return __return_storage_ptr__;
  }
  dyc<mocker::nasm::MemoryAddr,std::shared_ptr<mocker::nasm::Addr>const&>
            ((nasm *)&local_98,(shared_ptr<mocker::nasm::Addr> *)this);
  lVar15 = local_98;
  if (local_98 == 0) goto LAB_001a93b3;
  local_58 = local_98;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"[","");
  addr_01 = addr_00;
  if (*(long *)(local_98 + 8) != 0) {
    local_b8 = *(ulong **)(local_98 + 8);
    local_b0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_98 + 0x10);
    if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_b0->_M_use_count = local_b0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_b0->_M_use_count = local_b0->_M_use_count + 1;
      }
    }
    fmtAddr_abi_cxx11_(&local_f8,(nasm *)&local_b8,addr_00);
    std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_f8._M_dataplus._M_p);
    addr_01 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      addr_01 = extraout_RDX_00;
    }
    if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
      addr_01 = extraout_RDX_01;
    }
  }
  if (*(long *)(local_98 + 0x18) != 0) {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1) {
      std::__cxx11::string::append((char *)&local_d8);
      addr_01 = extraout_RDX_02;
    }
    local_68 = *(undefined8 *)(local_98 + 0x18);
    local_60 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_98 + 0x20);
    if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_60->_M_use_count = local_60->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_60->_M_use_count = local_60->_M_use_count + 1;
      }
    }
    fmtAddr_abi_cxx11_(&local_50,(nasm *)&local_68,addr_01);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_b8 = &local_a8;
    puVar9 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar9) {
      local_a8 = *puVar9;
      lStack_a0 = plVar5[3];
    }
    else {
      local_a8 = *puVar9;
      local_b8 = (ulong *)*plVar5;
    }
    local_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[1];
    *plVar5 = (long)puVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    uVar14 = *(uint *)(local_98 + 0x28);
    uVar3 = -uVar14;
    if (0 < (int)uVar14) {
      uVar3 = uVar14;
    }
    uVar13 = 1;
    if (9 < uVar3) {
      uVar11 = (ulong)uVar3;
      uVar4 = 4;
      do {
        uVar13 = uVar4;
        uVar7 = (uint)uVar11;
        if (uVar7 < 100) {
          uVar13 = uVar13 - 2;
          goto LAB_001a910b;
        }
        if (uVar7 < 1000) {
          uVar13 = uVar13 - 1;
          goto LAB_001a910b;
        }
        if (uVar7 < 10000) goto LAB_001a910b;
        uVar11 = uVar11 / 10000;
        uVar4 = uVar13 + 4;
      } while (99999 < uVar7);
      uVar13 = uVar13 + 1;
    }
LAB_001a910b:
    local_88 = local_78;
    std::__cxx11::string::_M_construct((ulong)&local_88,(char)uVar13 - (char)((int)uVar14 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar14 >> 0x1f) + (long)local_88),uVar13,uVar3);
    uVar11 = (long)&local_b0->_vptr__Sp_counted_base + local_80;
    uVar12 = 0xf;
    if (local_b8 != &local_a8) {
      uVar12 = local_a8;
    }
    if (uVar12 < uVar11) {
      uVar12 = 0xf;
      if (local_88 != local_78) {
        uVar12 = local_78[0];
      }
      if (uVar12 < uVar11) goto LAB_001a918d;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_b8);
    }
    else {
LAB_001a918d:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_88);
    }
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    psVar10 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_f8.field_2._M_allocated_capacity = *psVar10;
      local_f8.field_2._8_8_ = puVar6[3];
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar10;
      local_f8._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_f8._M_string_length = puVar6[1];
    *puVar6 = psVar10;
    puVar6[1] = 0;
    *(undefined1 *)psVar10 = 0;
    std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_f8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_88 != local_78) {
      operator_delete(local_88,local_78[0] + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
    }
  }
  if (*(int *)(local_98 + 0x30) != 0) {
    if (0 < *(int *)(local_98 + 0x30)) {
      std::__cxx11::string::append((char *)&local_d8);
    }
    uVar14 = *(uint *)(local_98 + 0x30);
    uVar3 = -uVar14;
    if (0 < (int)uVar14) {
      uVar3 = uVar14;
    }
    uVar13 = 1;
    if (9 < uVar3) {
      uVar11 = (ulong)uVar3;
      uVar4 = 4;
      do {
        uVar13 = uVar4;
        uVar7 = (uint)uVar11;
        if (uVar7 < 100) {
          uVar13 = uVar13 - 2;
          goto LAB_001a930c;
        }
        if (uVar7 < 1000) {
          uVar13 = uVar13 - 1;
          goto LAB_001a930c;
        }
        if (uVar7 < 10000) goto LAB_001a930c;
        uVar11 = uVar11 / 10000;
        uVar4 = uVar13 + 4;
      } while (99999 < uVar7);
      uVar13 = uVar13 + 1;
    }
LAB_001a930c:
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_f8,(char)uVar13 - (char)((int)uVar14 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_f8._M_dataplus._M_p + (uVar14 >> 0x1f),uVar13,uVar3);
    std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_f8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_d8._M_dataplus._M_p,
             local_d8._M_dataplus._M_p + (long)(_func_int ***)local_d8._M_string_length);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  lVar15 = local_58;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    lVar15 = local_58;
  }
LAB_001a93b3:
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  if (lVar15 == 0) {
    dyc<mocker::nasm::Label,std::shared_ptr<mocker::nasm::Addr>const&>
              ((nasm *)&local_d8,(shared_ptr<mocker::nasm::Addr> *)this);
    _Var2._M_p = local_d8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,*(long *)(local_d8._M_dataplus._M_p + 8),
                 *(long *)(local_d8._M_dataplus._M_p + 0x10) +
                 *(long *)(local_d8._M_dataplus._M_p + 8));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var2._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      dyc<mocker::nasm::LabelAddr,std::shared_ptr<mocker::nasm::Addr>const&>
                ((nasm *)&local_f8,(shared_ptr<mocker::nasm::Addr> *)this);
      _Var2._M_p = local_f8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::operator+(&local_d8,"[",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_f8._M_dataplus._M_p + 8));
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar10 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar10) {
          lVar15 = plVar5[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar15;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
        }
        __return_storage_ptr__->_M_string_length = plVar5[1];
        *plVar5 = (long)psVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/nasm/src/printer.cpp"
                      ,0x35,"std::string mocker::nasm::fmtAddr(const std::shared_ptr<Addr> &)");
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fmtAddr(const std::shared_ptr<Addr> &addr) {
  if (auto p = dyc<NumericConstant>(addr))
    return std::to_string(p->getVal());
  if (auto p = dyc<Register>(addr))
    return p->getIdentifier();
  if (auto p = dyc<MemoryAddr>(addr)) {
    std::string res = "[";
    if (p->getReg1())
      res += fmtAddr(p->getReg1());
    if (p->getReg2()) {
      if (res.size() != 1)
        res += "+";
      res += fmtAddr(p->getReg2()) + "*" + std::to_string(p->getScale());
    }
    if (p->getNumber() != 0) {
      if (p->getNumber() > 0)
        res += "+";
      res += std::to_string(p->getNumber());
    }
    return res + "]";
  }
  if (auto p = dyc<Label>(addr)) {
    return p->getName();
  }
  if (auto p = dyc<LabelAddr>(addr)) {
    return "[" + p->getLabelName() + "]";
  }
  assert(false);
}